

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int defragmentPage(MemPage *pPage,int nMaxFrag)

{
  ushort uVar1;
  u8 *puVar2;
  ushort uVar3;
  ushort uVar4;
  u16 uVar5;
  ushort uVar6;
  int iVar7;
  ushort *puVar8;
  ushort uVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  u8 *puVar17;
  u8 *local_70;
  
  puVar2 = pPage->aData;
  uVar12 = (ulong)pPage->hdrOffset;
  uVar9 = pPage->cellOffset;
  uVar1 = pPage->nCell;
  uVar13 = (uint)uVar9 + (uint)uVar1 * 2;
  uVar11 = pPage->pBt->usableSize;
  if ((nMaxFrag < (int)(uint)puVar2[uVar12 + 7]) ||
     (uVar3 = *(ushort *)(puVar2 + uVar12 + 1) << 8 | *(ushort *)(puVar2 + uVar12 + 1) >> 8,
     uVar3 == 0)) {
LAB_0013c2d5:
    local_70 = (u8 *)0x0;
    puVar17 = puVar2;
    uVar10 = uVar11;
    for (uVar15 = 0; uVar1 != uVar15; uVar15 = uVar15 + 1) {
      uVar3 = *(ushort *)(puVar2 + uVar15 * 2 + (ulong)uVar9) << 8 |
              *(ushort *)(puVar2 + uVar15 * 2 + (ulong)uVar9) >> 8;
      if ((uVar3 < uVar13) ||
         (uVar16 = (uint)uVar3, uVar16 != uVar11 - 4 && (int)(uVar11 - 4) <= (int)(uint)uVar3)) {
        iVar7 = 0xee36;
        goto LAB_0013c559;
      }
      uVar5 = (*pPage->xCellSize)(pPage,puVar17 + uVar16);
      uVar14 = uVar10 - uVar5;
      if (((int)uVar14 < (int)uVar13) || ((int)uVar11 < (int)((uint)uVar5 + (uint)uVar3))) {
        iVar7 = 0xee3c;
        goto LAB_0013c559;
      }
      *(ushort *)(puVar2 + uVar15 * 2 + (ulong)uVar9) = (ushort)uVar14 << 8 | (ushort)uVar14 >> 8;
      if (local_70 == (u8 *)0x0) {
        if (uVar14 != uVar16) {
          puVar17 = (u8 *)pPage->pBt->pPager->pTmpSpace;
          uVar3 = *(ushort *)(puVar2 + uVar12 + 5) << 8 | *(ushort *)(puVar2 + uVar12 + 5) >> 8;
          memcpy(puVar17 + uVar3,puVar2 + uVar3,(long)(int)(uVar10 - uVar3));
          local_70 = puVar17;
          goto LAB_0013c3d6;
        }
        local_70 = (u8 *)0x0;
      }
      else {
LAB_0013c3d6:
        memcpy(puVar2 + uVar14,puVar17 + uVar16,(ulong)uVar5);
      }
      uVar10 = uVar14;
    }
    puVar2[uVar12 + 7] = '\0';
    uVar11 = 0;
  }
  else {
    uVar4 = *(ushort *)(puVar2 + uVar3) << 8 | *(ushort *)(puVar2 + uVar3) >> 8;
    if ((uVar4 != 0) && ((puVar2[uVar4] != '\0' || (puVar2[(ulong)uVar4 + 1] != '\0'))))
    goto LAB_0013c2d5;
    uVar6 = *(ushort *)(puVar2 + (ulong)uVar3 + 2) << 8 |
            *(ushort *)(puVar2 + (ulong)uVar3 + 2) >> 8;
    uVar1 = *(ushort *)(puVar2 + uVar12 + 5);
    uVar16 = (uint)uVar6;
    uVar11 = (uint)uVar4;
    if (uVar11 == 0) {
      local_70._0_4_ = 0;
    }
    else {
      uVar10 = (uint)uVar6 + (uint)uVar3;
      if (uVar11 < uVar10) {
        iVar7 = 0xee17;
        goto LAB_0013c559;
      }
      uVar4 = *(ushort *)(puVar2 + (ulong)uVar4 + 2) << 8 |
              *(ushort *)(puVar2 + (ulong)uVar4 + 2) >> 8;
      local_70._0_4_ = (uint)uVar4;
      memmove(puVar2 + (uVar10 + uVar4),puVar2 + uVar10,(long)(int)(uVar11 - uVar10));
      uVar16 = (uint)uVar6 + (uint)uVar4;
    }
    uVar14 = (uint)(ushort)(uVar1 << 8 | uVar1 >> 8);
    uVar10 = uVar16 + uVar14;
    memmove(puVar2 + uVar10,puVar2 + uVar14,(long)(int)(uVar3 - uVar14));
    for (puVar8 = (ushort *)(puVar2 + uVar9); puVar8 < puVar2 + uVar13; puVar8 = puVar8 + 1) {
      uVar9 = *puVar8 << 8 | *puVar8 >> 8;
      uVar14 = uVar16;
      if (((uint)uVar9 < (uint)uVar3) || (uVar14 = (uint)local_70, uVar9 < uVar11)) {
        uVar9 = uVar9 + (short)uVar14;
        *puVar8 = uVar9 * 0x100 | uVar9 >> 8;
      }
    }
    uVar11 = (uint)puVar2[uVar12 + 7];
  }
  if (uVar11 + (uVar10 - uVar13) == (uint)pPage->nFree) {
    *(ushort *)(puVar2 + uVar12 + 5) = (ushort)uVar10 << 8 | (ushort)uVar10 >> 8;
    (puVar2 + uVar12 + 1)[0] = '\0';
    (puVar2 + uVar12 + 1)[1] = '\0';
    memset(puVar2 + uVar13,0,(long)(int)(uVar10 - uVar13));
    return 0;
  }
  iVar7 = 0xee50;
LAB_0013c559:
  iVar7 = sqlite3CorruptError(iVar7);
  return iVar7;
}

Assistant:

static int defragmentPage(MemPage *pPage, int nMaxFrag){
  int i;                     /* Loop counter */
  int pc;                    /* Address of the i-th cell */
  int hdr;                   /* Offset to the page header */
  int size;                  /* Size of a cell */
  int usableSize;            /* Number of usable bytes on a page */
  int cellOffset;            /* Offset to the cell pointer array */
  int cbrk;                  /* Offset to the cell content area */
  int nCell;                 /* Number of cells on the page */
  unsigned char *data;       /* The page data */
  unsigned char *temp;       /* Temp area for cell content */
  unsigned char *src;        /* Source of content */
  int iCellFirst;            /* First allowable cell index */
  int iCellLast;             /* Last possible cell index */

  assert( sqlite3PagerIswriteable(pPage->pDbPage) );
  assert( pPage->pBt!=0 );
  assert( pPage->pBt->usableSize <= SQLITE_MAX_PAGE_SIZE );
  assert( pPage->nOverflow==0 );
  assert( sqlite3_mutex_held(pPage->pBt->mutex) );
  temp = 0;
  src = data = pPage->aData;
  hdr = pPage->hdrOffset;
  cellOffset = pPage->cellOffset;
  nCell = pPage->nCell;
  assert( nCell==get2byte(&data[hdr+3]) );
  iCellFirst = cellOffset + 2*nCell;
  usableSize = pPage->pBt->usableSize;

  /* This block handles pages with two or fewer free blocks and nMaxFrag
  ** or fewer fragmented bytes. In this case it is faster to move the
  ** two (or one) blocks of cells using memmove() and add the required
  ** offsets to each pointer in the cell-pointer array than it is to 
  ** reconstruct the entire page.  */
  if( (int)data[hdr+7]<=nMaxFrag ){
    int iFree = get2byte(&data[hdr+1]);
    if( iFree ){
      int iFree2 = get2byte(&data[iFree]);

      /* pageFindSlot() has already verified that free blocks are sorted
      ** in order of offset within the page, and that no block extends
      ** past the end of the page. Provided the two free slots do not 
      ** overlap, this guarantees that the memmove() calls below will not
      ** overwrite the usableSize byte buffer, even if the database page
      ** is corrupt.  */
      assert( iFree2==0 || iFree2>iFree );
      assert( iFree+get2byte(&data[iFree+2]) <= usableSize );
      assert( iFree2==0 || iFree2+get2byte(&data[iFree2+2]) <= usableSize );

      if( 0==iFree2 || (data[iFree2]==0 && data[iFree2+1]==0) ){
        u8 *pEnd = &data[cellOffset + nCell*2];
        u8 *pAddr;
        int sz2 = 0;
        int sz = get2byte(&data[iFree+2]);
        int top = get2byte(&data[hdr+5]);
        if( iFree2 ){
          if( iFree+sz>iFree2 ) return SQLITE_CORRUPT_PGNO(pPage->pgno);
          sz2 = get2byte(&data[iFree2+2]);
          assert( iFree+sz+sz2+iFree2-(iFree+sz) <= usableSize );
          memmove(&data[iFree+sz+sz2], &data[iFree+sz], iFree2-(iFree+sz));
          sz += sz2;
        }
        cbrk = top+sz;
        assert( cbrk+(iFree-top) <= usableSize );
        memmove(&data[cbrk], &data[top], iFree-top);
        for(pAddr=&data[cellOffset]; pAddr<pEnd; pAddr+=2){
          pc = get2byte(pAddr);
          if( pc<iFree ){ put2byte(pAddr, pc+sz); }
          else if( pc<iFree2 ){ put2byte(pAddr, pc+sz2); }
        }
        goto defragment_out;
      }
    }
  }

  cbrk = usableSize;
  iCellLast = usableSize - 4;
  for(i=0; i<nCell; i++){
    u8 *pAddr;     /* The i-th cell pointer */
    pAddr = &data[cellOffset + i*2];
    pc = get2byte(pAddr);
    testcase( pc==iCellFirst );
    testcase( pc==iCellLast );
    /* These conditions have already been verified in btreeInitPage()
    ** if PRAGMA cell_size_check=ON.
    */
    if( pc<iCellFirst || pc>iCellLast ){
      return SQLITE_CORRUPT_PGNO(pPage->pgno);
    }
    assert( pc>=iCellFirst && pc<=iCellLast );
    size = pPage->xCellSize(pPage, &src[pc]);
    cbrk -= size;
    if( cbrk<iCellFirst || pc+size>usableSize ){
      return SQLITE_CORRUPT_PGNO(pPage->pgno);
    }
    assert( cbrk+size<=usableSize && cbrk>=iCellFirst );
    testcase( cbrk+size==usableSize );
    testcase( pc+size==usableSize );
    put2byte(pAddr, cbrk);
    if( temp==0 ){
      int x;
      if( cbrk==pc ) continue;
      temp = sqlite3PagerTempSpace(pPage->pBt->pPager);
      x = get2byte(&data[hdr+5]);
      memcpy(&temp[x], &data[x], (cbrk+size) - x);
      src = temp;
    }
    memcpy(&data[cbrk], &src[pc], size);
  }
  data[hdr+7] = 0;

 defragment_out:
  if( data[hdr+7]+cbrk-iCellFirst!=pPage->nFree ){
    return SQLITE_CORRUPT_PGNO(pPage->pgno);
  }
  assert( cbrk>=iCellFirst );
  put2byte(&data[hdr+5], cbrk);
  data[hdr+1] = 0;
  data[hdr+2] = 0;
  memset(&data[iCellFirst], 0, cbrk-iCellFirst);
  assert( sqlite3PagerIswriteable(pPage->pDbPage) );
  return SQLITE_OK;
}